

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerMSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t physical_type_id,bool is_packed,bool relaxed)

{
  bool bVar1;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  char (*pacVar2) [2];
  string local_90 [32];
  string local_70;
  string local_50 [32];
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,physical_type_id);
  pacVar2 = (char (*) [2])(ulong)physical_type_id;
  bVar1 = Compiler::is_matrix((Compiler *)this,exp_type);
  if (bVar1) {
    CompilerGLSL::strip_enclosed_expression(&this->super_CompilerGLSL,exp_str);
    if (physical_type_id != 0 || is_packed) {
      ::std::__cxx11::string::string(local_90,(string *)exp_str);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])
                (local_50,this,local_90,exp_type,pacVar2,(ulong)is_packed,1);
      ::std::__cxx11::string::operator=((string *)exp_str,local_50);
      ::std::__cxx11::string::~string(local_50);
      ::std::__cxx11::string::~string(local_90);
      ts_2 = pacVar2;
    }
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x33791d,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,ts_2);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_70,(string *)exp_str);
    CompilerGLSL::convert_row_major_matrix
              (__return_storage_ptr__,&this->super_CompilerGLSL,&local_70,exp_type,physical_type_id,
               is_packed,relaxed);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t physical_type_id,
                                             bool is_packed, bool relaxed)
{
	if (!is_matrix(exp_type))
	{
		return CompilerGLSL::convert_row_major_matrix(std::move(exp_str), exp_type, physical_type_id, is_packed, relaxed);
	}
	else
	{
		strip_enclosed_expression(exp_str);
		if (physical_type_id != 0 || is_packed)
			exp_str = unpack_expression_type(exp_str, exp_type, physical_type_id, is_packed, true);
		return join("transpose(", exp_str, ")");
	}
}